

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

void duckdb::UnaryExecutor::
     ExecuteStandard<duckdb::hugeint_t,signed_char,duckdb::UnaryOperatorWrapper,duckdb::SignOperator>
               (Vector *input,Vector *result,idx_t count,void *dataptr,bool adds_nulls,
               FunctionErrors errors)

{
  hugeint_t input_00;
  VectorType VVar1;
  char cVar2;
  bool bVar3;
  ValidityMask *result_data_00;
  idx_t iVar4;
  hugeint_t *phVar5;
  SelectionVector *pSVar6;
  ValidityMask *pVVar7;
  UnifiedVectorFormat *in_RDX;
  Vector *in_RSI;
  Vector *in_RDI;
  undefined4 in_R8D;
  char in_R9B;
  uint uVar8;
  hugeint_t *ldata_3;
  char *result_data_3;
  UnifiedVectorFormat vdata;
  SelectionVector *offsets;
  hugeint_t *ldata_2;
  char *result_data_2;
  Vector *dictionary_values;
  optional_idx dict_size;
  hugeint_t *ldata_1;
  char *result_data_1;
  hugeint_t *ldata;
  char *result_data;
  Vector *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  idx_t in_stack_fffffffffffffe68;
  ValidityMask *in_stack_fffffffffffffe70;
  uint64_t in_stack_fffffffffffffe78;
  int64_t in_stack_fffffffffffffe80;
  UnifiedVectorFormat *this;
  ValidityMask *in_stack_fffffffffffffea0;
  SelectionVector *in_stack_fffffffffffffea8;
  idx_t in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  hugeint_t *in_stack_fffffffffffffec0;
  undefined1 uVar9;
  void *in_stack_fffffffffffffec8;
  Vector *pVVar10;
  ValidityMask *in_stack_fffffffffffffed0;
  ValidityMask *in_stack_fffffffffffffed8;
  idx_t in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  UnifiedVectorFormat local_c8 [72];
  SelectionVector *local_80;
  hugeint_t *local_78;
  char *local_70;
  Vector *local_68;
  optional_idx local_60;
  hugeint_t *local_58;
  ValidityMask *local_50;
  uint64_t local_48;
  int64_t local_40;
  hugeint_t *local_38;
  char *local_30;
  char local_22;
  byte local_21;
  UnifiedVectorFormat *local_18;
  Vector *local_10;
  Vector *local_8;
  
  local_21 = (byte)in_R8D & 1;
  local_22 = in_R9B;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == FLAT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_10);
    uVar9 = (undefined1)((ulong)in_stack_fffffffffffffec0 >> 0x38);
    local_50 = (ValidityMask *)FlatVector::GetData<signed_char>((Vector *)0xdf5346);
    phVar5 = FlatVector::GetData<duckdb::hugeint_t>((Vector *)0xdf535b);
    pVVar7 = local_50;
    local_58 = phVar5;
    result_data_00 = FlatVector::Validity((Vector *)0xdf539d);
    FlatVector::Validity((Vector *)0xdf53b2);
    ExecuteFlat<duckdb::hugeint_t,signed_char,duckdb::UnaryOperatorWrapper,duckdb::SignOperator>
              ((hugeint_t *)CONCAT44(in_R8D,in_stack_fffffffffffffef0),(char *)result_data_00,
               (idx_t)local_18,pVVar7,(ValidityMask *)phVar5,in_stack_fffffffffffffec8,(bool)uVar9);
  }
  else if (VVar1 == CONSTANT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_10);
    local_30 = ConstantVector::GetData<signed_char>((Vector *)0xdf5276);
    local_38 = ConstantVector::GetData<duckdb::hugeint_t>((Vector *)0xdf528b);
    bVar3 = ConstantVector::IsNull((Vector *)0xdf52a0);
    if (bVar3) {
      duckdb::ConstantVector::SetNull(local_10,true);
    }
    else {
      duckdb::ConstantVector::SetNull(local_10,false);
      local_48 = local_38->lower;
      local_40 = local_38->upper;
      ConstantVector::Validity(local_10);
      input_00.upper = in_stack_fffffffffffffe80;
      input_00.lower = in_stack_fffffffffffffe78;
      cVar2 = UnaryOperatorWrapper::Operation<duckdb::SignOperator,duckdb::hugeint_t,signed_char>
                        (input_00,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                         (void *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      *local_30 = cVar2;
    }
  }
  else {
    if ((VVar1 == DICTIONARY_VECTOR) && (local_22 == '\0')) {
      local_60 = DictionaryVector::DictionarySize(in_stack_fffffffffffffe58);
      bVar3 = optional_idx::IsValid(&local_60);
      if ((bVar3) &&
         (iVar4 = optional_idx::GetIndex((optional_idx *)in_stack_fffffffffffffea0),
         (UnifiedVectorFormat *)(iVar4 * 2) < local_18 || (long)(iVar4 * 2) - (long)local_18 == 0))
      {
        local_68 = DictionaryVector::Child((Vector *)0xdf5457);
        VVar1 = Vector::GetVectorType(local_68);
        if (VVar1 == FLAT_VECTOR) {
          local_70 = FlatVector::GetData<signed_char>((Vector *)0xdf5481);
          uVar9 = (undefined1)((ulong)in_stack_fffffffffffffec0 >> 0x38);
          phVar5 = FlatVector::GetData<duckdb::hugeint_t>((Vector *)0xdf5496);
          local_78 = phVar5;
          optional_idx::GetIndex((optional_idx *)phVar5);
          FlatVector::Validity((Vector *)0xdf54d7);
          FlatVector::Validity((Vector *)0xdf54e9);
          ExecuteFlat<duckdb::hugeint_t,signed_char,duckdb::UnaryOperatorWrapper,duckdb::SignOperator>
                    ((hugeint_t *)CONCAT44(in_R8D,in_stack_fffffffffffffef0),
                     in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                     in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,(bool)uVar9);
          local_80 = DictionaryVector::SelVector((Vector *)0xdf5529);
          pVVar10 = local_10;
          pSVar6 = (SelectionVector *)optional_idx::GetIndex((optional_idx *)phVar5);
          duckdb::Vector::Dictionary(local_10,(ulong)pVVar10,pSVar6,(ulong)local_80);
          return;
        }
      }
    }
    this = local_c8;
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(this);
    duckdb::Vector::ToUnifiedFormat((ulong)local_8,local_18);
    duckdb::Vector::SetVectorType((VectorType)local_10);
    FlatVector::GetData<signed_char>((Vector *)0xdf55d1);
    UnifiedVectorFormat::GetData<duckdb::hugeint_t>(local_c8);
    pVVar7 = FlatVector::Validity((Vector *)0xdf563c);
    uVar8 = local_21 & 1;
    ExecuteLoop<duckdb::hugeint_t,signed_char,duckdb::UnaryOperatorWrapper,duckdb::SignOperator>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,(ValidityMask *)this,
               in_stack_fffffffffffffed0,SUB81((ulong)pVVar7 >> 0x38,0));
    UnifiedVectorFormat::~UnifiedVectorFormat
              ((UnifiedVectorFormat *)CONCAT44(in_stack_fffffffffffffe64,uVar8));
  }
  return;
}

Assistant:

static inline void ExecuteStandard(Vector &input, Vector &result, idx_t count, void *dataptr, bool adds_nulls,
	                                   FunctionErrors errors = FunctionErrors::CAN_THROW_RUNTIME_ERROR) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
			auto ldata = ConstantVector::GetData<INPUT_TYPE>(input);

			if (ConstantVector::IsNull(input)) {
				ConstantVector::SetNull(result, true);
			} else {
				ConstantVector::SetNull(result, false);
				*result_data = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
				    *ldata, ConstantVector::Validity(result), 0, dataptr);
			}
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = FlatVector::GetData<INPUT_TYPE>(input);

			ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, FlatVector::Validity(input),
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		case VectorType::DICTIONARY_VECTOR: {
			// dictionary vector - we can run the function ONLY on the dictionary in some cases
			// we can only do this if the function does not throw errors
			// we can execute the function on a value that is in the dictionary but that is not referenced
			// if the function can throw errors - this will result in us (incorrectly) throwing an error
			if (errors == FunctionErrors::CANNOT_ERROR) {
				static constexpr idx_t DICTIONARY_THRESHOLD = 2;
				auto dict_size = DictionaryVector::DictionarySize(input);
				if (dict_size.IsValid() && dict_size.GetIndex() * DICTIONARY_THRESHOLD <= count) {
					// we can operate directly on the dictionary if we have a dictionary size
					// but this only makes sense if the dictionary size is smaller than the count by some factor
					auto &dictionary_values = DictionaryVector::Child(input);
					if (dictionary_values.GetVectorType() == VectorType::FLAT_VECTOR) {
						// execute the function over the dictionary
						auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
						auto ldata = FlatVector::GetData<INPUT_TYPE>(dictionary_values);
						ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(
						    ldata, result_data, dict_size.GetIndex(), FlatVector::Validity(dictionary_values),
						    FlatVector::Validity(result), dataptr, adds_nulls);
						// slice the result with the original offsets
						auto &offsets = DictionaryVector::SelVector(input);
						result.Dictionary(result, dict_size.GetIndex(), offsets, count);
						break;
					}
				}
			}
			DUCKDB_EXPLICIT_FALLTHROUGH;
		}
#endif
		default: {
			UnifiedVectorFormat vdata;
			input.ToUnifiedFormat(count, vdata);

			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = UnifiedVectorFormat::GetData<INPUT_TYPE>(vdata);

			ExecuteLoop<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, vdata.sel, vdata.validity,
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		}
	}